

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

uint __thiscall
Inline::FillInlineesDataArray
          (Inline *this,FunctionJITTimeInfo *inlineeJitTimeData,
          FunctionJITTimeInfo **inlineesDataArray,uint inlineesDataArrayLength)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  intptr_t polyFuncInfo;
  JITTimeFunctionBody *pJVar3;
  JITTimeFunctionBody *pJVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  uint k;
  FunctionJITTimeInfo *rightInlineeJitTimeData;
  intptr_t inlineeFunctionInfoAddr;
  uint inlineeCount;
  uint inlineesDataArrayLength_local;
  FunctionJITTimeInfo **inlineesDataArray_local;
  FunctionJITTimeInfo *inlineeJitTimeData_local;
  Inline *this_local;
  
  inlineeFunctionInfoAddr._0_4_ = 0;
  inlineesDataArray_local = (FunctionJITTimeInfo **)inlineeJitTimeData;
  while( true ) {
    if (inlineesDataArray_local == (FunctionJITTimeInfo **)0x0) {
      return (uint)inlineeFunctionInfoAddr;
    }
    if (inlineesDataArrayLength <= (uint)inlineeFunctionInfoAddr) break;
    polyFuncInfo = FunctionJITTimeInfo::GetFunctionInfoAddr
                             ((FunctionJITTimeInfo *)inlineesDataArray_local);
    bVar2 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)inlineesDataArray_local);
    if (bVar2) {
      sourceContextId =
           FunctionJITTimeInfo::GetSourceContextId((FunctionJITTimeInfo *)inlineesDataArray_local);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId
                             ((FunctionJITTimeInfo *)inlineesDataArray_local);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eafdf0,PolymorphicInlinePhase,sourceContextId,functionId);
      if (!bVar2) {
        register0x00000000 =
             FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                       ((FunctionJITTimeInfo *)inlineesDataArray_local,polyFuncInfo);
        if (register0x00000000 == (FunctionJITTimeInfo *)0x0) {
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
          if (bVar2) {
            pJVar3 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)inlineesDataArray_local);
            pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar3);
            pcVar7 = FunctionJITTimeInfo::GetDebugNumberSet
                               ((FunctionJITTimeInfo *)inlineesDataArray_local,
                                (wchar (*) [42])local_98);
            Output::Print(L"INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"
                          ,pcVar6,pcVar7);
            Output::Flush();
          }
        }
        else {
          inlineesDataArray[(uint)inlineeFunctionInfoAddr] = register0x00000000;
          pJVar3 = FunctionJITTimeInfo::GetBody(register0x00000000);
          pJVar4 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)inlineesDataArray_local);
          if (pJVar3 != pJVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x287,
                               "(rightInlineeJitTimeData->GetBody() == inlineeJitTimeData->GetBody())"
                               ,
                               "rightInlineeJitTimeData->GetBody() == inlineeJitTimeData->GetBody()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          debugStringBuffer[0x26] = L'\0';
          debugStringBuffer[0x27] = L'\0';
          for (; (uint)debugStringBuffer._76_4_ < (uint)inlineeFunctionInfoAddr;
              debugStringBuffer._76_4_ = debugStringBuffer._76_4_ + 1) {
            pJVar3 = FunctionJITTimeInfo::GetBody(inlineesDataArray[(uint)debugStringBuffer._76_4_])
            ;
            pJVar4 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)inlineesDataArray_local);
            if (pJVar3 == pJVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x28d,"(false)","We should never see duplicate function body here"
                                );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
          }
          inlineeFunctionInfoAddr._0_4_ = (uint)inlineeFunctionInfoAddr + 1;
        }
      }
    }
    inlineesDataArray_local =
         (FunctionJITTimeInfo **)
         FunctionJITTimeInfo::GetNext((FunctionJITTimeInfo *)inlineesDataArray_local);
  }
  for (; inlineesDataArray_local != (FunctionJITTimeInfo **)0x0;
      inlineesDataArray_local =
           (FunctionJITTimeInfo **)
           FunctionJITTimeInfo::GetNext((FunctionJITTimeInfo *)inlineesDataArray_local)) {
    inlineeFunctionInfoAddr._0_4_ = (uint)inlineeFunctionInfoAddr + 1;
  }
  return (uint)inlineeFunctionInfoAddr;
}

Assistant:

uint Inline::FillInlineesDataArray(
        const FunctionJITTimeInfo* inlineeJitTimeData,
        _Out_writes_to_(inlineesDataArrayLength, (return >= inlineesDataArrayLength ? inlineesDataArrayLength : return)) const FunctionJITTimeInfo ** inlineesDataArray,
        uint inlineesDataArrayLength
        )
{
    uint inlineeCount = 0;
    while(inlineeJitTimeData)
    {
        if (inlineeCount >= inlineesDataArrayLength)
        {
            // Count the actual number of inlinees for logging.
            while (inlineeJitTimeData)
            {
                inlineeCount++;
                inlineeJitTimeData = inlineeJitTimeData->GetNext();
            }
            return inlineeCount;
        }

        intptr_t inlineeFunctionInfoAddr = inlineeJitTimeData->GetFunctionInfoAddr();
#ifdef DBG
        if (inlineeJitTimeData->HasBody() && !PHASE_OFF(Js::PolymorphicInlinePhase, inlineeJitTimeData))
#endif
        {
            const FunctionJITTimeInfo* rightInlineeJitTimeData = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeFunctionInfoAddr);

            if (rightInlineeJitTimeData)
            {
                inlineesDataArray[inlineeCount] = rightInlineeJitTimeData;
                Assert(rightInlineeJitTimeData->GetBody() == inlineeJitTimeData->GetBody());
#ifdef DBG
                for (uint k = 0; k < inlineeCount; k++)
                {
                    if (inlineesDataArray[k]->GetBody()  == inlineeJitTimeData->GetBody())
                    {
                        AssertMsg(false, "We should never see duplicate function body here");
                    }
                }
#endif
                inlineeCount++;
            }
            else
            {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer));
            }
        }
        inlineeJitTimeData = inlineeJitTimeData->GetNext();
    }

    return inlineeCount;
}